

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O2

void __thiscall
Array_AllItemsMustBeOfOneType2_Test::TestBody(Array_AllItemsMustBeOfOneType2_Test *this)

{
  bool bVar1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_1b8;
  AssertHelper local_1b0;
  events_aggregator_t handler;
  istringstream input;
  
  std::__cxx11::string::string((string *)&handler,"key = [1, \'abc\']",(allocator *)&sStack_1b8);
  std::__cxx11::istringstream::istringstream((istringstream *)&input,(string *)&handler,_S_in);
  std::__cxx11::string::~string((string *)&handler);
  handler.events.super__Vector_base<sax_event_t,_std::allocator<sax_event_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  handler.events.super__Vector_base<sax_event_t,_std::allocator<sax_event_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  handler.events.super__Vector_base<sax_event_t,_std::allocator<sax_event_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    loltoml::v_0_1_1::parse<events_aggregator_t>((istream *)&input,&handler);
  }
  testing::Message::Message((Message *)&sStack_1b8);
  testing::internal::AssertHelper::AssertHelper
            (&local_1b0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/andrusha97[P]loltoml/tests/array.cpp"
             ,0x119,
             "Expected: loltoml::parse(input, handler) throws an exception of type loltoml::parser_error_t.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&sStack_1b8);
  testing::internal::AssertHelper::~AssertHelper(&local_1b0);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&sStack_1b8);
  std::vector<sax_event_t,_std::allocator<sax_event_t>_>::~vector(&handler.events);
  std::__cxx11::istringstream::~istringstream((istringstream *)&input);
  return;
}

Assistant:

TEST(Array, AllItemsMustBeOfOneType2) {
    std::istringstream input("key = [1, 'abc']");
    events_aggregator_t handler;

    EXPECT_THROW(loltoml::parse(input, handler), loltoml::parser_error_t);
}